

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vmaskmovps2_(PDISASM pMyDisasm)

{
  Int32 IVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).VEX.state != '\x01'))
  {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    IVar1 = -1;
  }
  else {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmaskmovps",0xb);
    vex_EyGy(pMyDisasm);
    IVar1 = 2;
    if ((pMyDisasm->Reserved_).REX.W_ != '\x01') {
      return;
    }
  }
  (pMyDisasm->Reserved_).ERROR_OPCODE = IVar1;
  return;
}

Assistant:

void __bea_callspec__ vmaskmovps2_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmaskmovps");
    #endif
    vex_EyGy(pMyDisasm);
    if (GV.REX.W_ == 1) GV.ERROR_OPCODE = UD_;
  }
  else {
    failDecode(pMyDisasm);
  }
}